

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O1

void __thiscall
diy::Master::Proxy::Proxy(Proxy *this,Master *master__,int gid__,IExchangeInfo *iexchange__)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>
  _Var2;
  mapped_type *pmVar3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  accessor access;
  iterator __begin3;
  unique_lock<tthread::fast_mutex> local_58;
  iterator local_48;
  
  this->gid_ = gid__;
  this->master_ = master__;
  this->iexchange_ = iexchange__;
  p_Var5 = &(this->incoming_)._M_t._M_impl.super__Rb_tree_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (this->incoming_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = &(this->outgoing_)._M_t._M_impl.super__Rb_tree_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (this->outgoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.it._M_node._0_4_ = gid__;
  pmVar3 = std::
           map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
           ::operator[](&((master__->collectives_)._M_t.
                          super___uniq_ptr_impl<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_diy::Master::CollectivesMap_*,_std::default_delete<diy::Master::CollectivesMap>_>
                          .super__Head_base<0UL,_diy::Master::CollectivesMap_*,_false>._M_head_impl)
                         ->
                         super_map<int,_diy::Master::CollectivesList,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::CollectivesList>_>_>
                        ,(key_type *)&local_48);
  this->collectives_ = pmVar3;
  this->done_ = false;
  fill_incoming(this);
  if (this->iexchange_ == (IExchangeInfo *)0x0) {
    local_48.it._M_node._0_4_ = this->gid_;
    this_00 = std::
              map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
              ::operator[](&this->master_->outgoing_,(key_type *)&local_48);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::begin(&local_48,this_00);
    p_Var5 = &(this_00->map_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_48.it._M_node != p_Var5) {
      do {
        _Var2._M_node = local_48.it._M_node;
        p_Var1 = local_48.it._M_node + 1;
        local_58._M_device = (mutex_type *)&local_48.it._M_node[3]._M_right;
        local_58._M_owns = false;
        std::unique_lock<tthread::fast_mutex>::lock(&local_58);
        local_58._M_owns = true;
        p_Var4 = _Var2._M_node[2]._M_right;
        if (p_Var4 != _Var2._M_node[1]._M_right) {
          if (p_Var4 == *(_Base_ptr *)(_Var2._M_node + 3)) {
            p_Var4 = (_Base_ptr)&_Var2._M_node[3]._M_left[-1]._M_right[0xd]._M_right;
          }
          std::
          _Rb_tree<diy::BlockID,std::pair<diy::BlockID_const,diy::MemoryBuffer>,std::_Select1st<std::pair<diy::BlockID_const,diy::MemoryBuffer>>,std::less<diy::BlockID>,std::allocator<std::pair<diy::BlockID_const,diy::MemoryBuffer>>>
          ::_M_emplace_unique<diy::BlockID_const&,diy::MemoryBuffer>
                    ((_Rb_tree<diy::BlockID,std::pair<diy::BlockID_const,diy::MemoryBuffer>,std::_Select1st<std::pair<diy::BlockID_const,diy::MemoryBuffer>>,std::less<diy::BlockID>,std::allocator<std::pair<diy::BlockID_const,diy::MemoryBuffer>>>
                      *)&this->outgoing_,(BlockID *)(_Var2._M_node + 1),
                     (MemoryBuffer *)&p_Var4[-3]._M_right);
          std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::pop_back
                    ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                     &p_Var1->_M_parent);
        }
        if ((local_58._M_owns == true) && (local_58._M_device != (mutex_type *)0x0)) {
          LOCK();
          *local_58._M_device = 0;
          UNLOCK();
          local_58._M_owns = false;
        }
        local_48.it._M_node = (_Base_ptr)std::_Rb_tree_increment(local_48.it._M_node);
      } while ((_Rb_tree_header *)local_48.it._M_node != p_Var5);
    }
    if (local_48.lock_ptr.
        super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.lock_ptr.
                 super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

Proxy(Master* master__, int gid__,
                              IExchangeInfo*  iexchange__ = 0):
                          gid_(gid__),
                          master_(master__),
                          iexchange_(iexchange__),
                          collectives_(&master__->collectives(gid__))
    {
        fill_incoming();

        // move outgoing_ back into proxy, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : master_->outgoing(gid_))
            {
                auto access = x.second.access();
                if (!access->empty())
                {
                    outgoing_.emplace(x.first, access->back().move());
                    access->pop_back();
                }
            }
    }